

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

string * __thiscall
glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::getVertexShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,
          TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this,
          bool should_pass_pointsize_data)

{
  char *pcVar1;
  stringstream result_sstream;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,"${VERSION}\n\n");
  pcVar1 = "${OUT_PER_VERTEX_DECL}";
  if (should_pass_pointsize_data) {
    pcVar1 = "${OUT_PER_VERTEX_DECL_POINT_SIZE}";
  }
  std::operator<<(&local_190,pcVar1);
  std::operator<<(&local_190,"\nvoid main()\n{\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::getVertexShaderCode(
	bool should_pass_pointsize_data)
{
	std::stringstream result_sstream;
	result_sstream << "${VERSION}\n\n";
	if (should_pass_pointsize_data)
	{
		result_sstream << "${OUT_PER_VERTEX_DECL_POINT_SIZE}";
	}
	else
	{
		result_sstream << "${OUT_PER_VERTEX_DECL}";
	}
	result_sstream << "\n"
					  "void main()\n"
					  "{\n"
					  "}\n";

	return result_sstream.str();
}